

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O1

void __thiscall
BasicTestingSetup::BasicTestingSetup(BasicTestingSetup *this,ChainType chainType,TestOpts opts)

{
  ArgsManager *this_00;
  ArgsManager *pAVar1;
  pointer pcVar2;
  _Head_base<0UL,_kernel::Context_*,_false> _Var3;
  Chain *pCVar4;
  pointer pcVar5;
  size_type sVar6;
  string arg_00;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  path path;
  pointer ppcVar7;
  pointer ppcVar8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var9;
  bool bVar10;
  LockResult LVar11;
  basic_ostream<char,_std::char_traits<char>_> *pbVar12;
  Logger *pLVar13;
  Warnings *this_01;
  _Head_base<0UL,_kernel::Context_*,_false> this_02;
  ECC_Context *this_03;
  runtime_error *this_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  undefined8 extraout_RAX_00;
  long lVar15;
  path *this_05;
  long *in_RDX;
  BasicTestingSetup *extraout_RDX;
  char **arg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  undefined8 *puVar17;
  iterator ppcVar18;
  BasicTestingSetup *this_06;
  char **arg_1;
  undefined1 auVar19 [8];
  BasicTestingSetup *pBVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  NodeContext *context;
  long in_FS_OFFSET;
  byte bVar22;
  initializer_list<const_char_*> __l;
  Span<std::byte> output;
  string_view str_err;
  string_view str_err_00;
  string_view str_err_01;
  string error;
  string test_path;
  path root_dir;
  undefined8 in_stack_fffffffffffffce8;
  BasicTestingSetup *this_07;
  BasicTestingSetup *this_08;
  NodeContext *this_09;
  undefined4 in_stack_fffffffffffffd08;
  _Any_data local_2e8;
  code *local_2d8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_2c8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_2a8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_288;
  OptionsCategory local_26c;
  path local_268;
  path local_240;
  path local_218;
  undefined1 local_1f0 [72];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _List local_188;
  undefined1 local_160 [40];
  path local_138;
  undefined1 local_110 [40];
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _List local_c8;
  undefined1 local_c0 [32];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_a0;
  _Head_base<0UL,_CBlockPolicyEstimator_*,_false> local_98 [2];
  _Any_data local_88;
  string local_78;
  string local_58;
  _Head_base<0UL,_interfaces::Mining_*,_false> local_38;
  
  bVar22 = 0;
  local_38._M_head_impl =
       *(Mining **)
        &((__uniq_ptr_impl<interfaces::Mining,_std::default_delete<interfaces::Mining>_> *)
         (in_FS_OFFSET + 0x28))->_M_t;
  util::SignalInterrupt::SignalInterrupt(&this->m_interrupt);
  this_09 = &this->m_node;
  ::node::NodeContext::NodeContext(this_09);
  FastRandomContext::FastRandomContext(&this->m_rng,false);
  this_07 = (BasicTestingSetup *)&this->m_path_root;
  std::filesystem::__cxx11::path::path((path *)this_07);
  this_08 = (BasicTestingSetup *)&this->m_path_lock;
  std::filesystem::__cxx11::path::path((path *)this_08);
  this->m_has_custom_datadir = false;
  this_00 = &this->m_args;
  ArgsManager::ArgsManager(this_00);
  (this->m_node).shutdown = &this->m_interrupt;
  (this->m_node).args = &gArgs;
  puVar17 = &DAT_013db358;
  ppcVar18 = (iterator)local_1a8;
  for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
    *ppcVar18 = (char *)*puVar17;
    puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
    ppcVar18 = ppcVar18 + (ulong)bVar22 * -2 + 1;
  }
  pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  __l._M_len = 9;
  __l._M_array = (iterator)local_1a8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_2a8,__l,(allocator_type *)pbVar14);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_2a8,
             (in_RDX[1] - *in_RDX >> 3) +
             ((long)local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3));
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*in_RDX;
  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_RDX[1];
  if (paVar16 != paVar21) {
    do {
      if (local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_2a8,
                   (iterator)
                   local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_finish,(char **)&paVar16->_M_allocated_capacity);
      }
      else {
        *local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish = (char *)paVar16->_M_allocated_capacity;
        local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar16->_M_allocated_capacity + 1);
    } while (paVar16 != paVar21);
  }
  local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (G_TEST_COMMAND_LINE_ARGUMENTS.super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0084349a:
    paVar21 = &local_198;
    local_1a8 = (undefined1  [8])paVar21;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"test","");
    util::ThreadRename((string *)local_1a8);
    pBVar20 = this_07;
    context = this_09;
    if (local_1a8 != (undefined1  [8])paVar21) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
      pBVar20 = this_07;
      context = this_09;
    }
    ArgsManager::ClearPathCache(&gArgs);
    SetupServerArgs((this->m_node).args);
    pAVar1 = (this->m_node).args;
    local_58.field_2._M_allocated_capacity = 0x746164747365742d;
    local_58.field_2._8_4_ = 0x72696461;
    local_58._M_string_length = 0xc;
    local_58.field_2._M_local_buf[0xc] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::filesystem::temp_directory_path_abi_cxx11_();
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_138,&TEST_DIR_PATH_ELEMENT,auto_format);
    std::filesystem::__cxx11::operator/((path *)local_e8,(path *)local_110,&local_138);
    std::filesystem::__cxx11::path::path<char[1],std::filesystem::__cxx11::path>
              ((path *)local_160,(char (*) [1])0xf98c4c,auto_format);
    std::filesystem::__cxx11::operator/((path *)local_c0,(path *)local_e8,(path *)local_160);
    std::filesystem::__cxx11::path::path((path *)local_1a8,(path *)local_c0);
    local_98[0]._M_head_impl = (CBlockPolicyEstimator *)&local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_1a8,(pointer)((long)paStack_1a0 + (long)local_1a8));
    tinyformat::format<std::__cxx11::string>
              (&local_78,(tinyformat *)"Custom data directory (default: %s<random_string>)",
               (char *)local_98,pbVar14);
    local_26c = DEBUG_TEST;
    ArgsManager::AddArg(pAVar1,&local_58,&local_78,1,&local_26c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((_Any_data *)local_98[0]._M_head_impl != &local_88) {
      operator_delete(local_98[0]._M_head_impl,(ulong)(local_88._M_unused._M_member_pointer + 1));
    }
    std::filesystem::__cxx11::path::~path((path *)local_1a8);
    std::filesystem::__cxx11::path::~path((path *)local_c0);
    std::filesystem::__cxx11::path::~path((path *)local_160);
    std::filesystem::__cxx11::path::~path((path *)local_e8);
    std::filesystem::__cxx11::path::~path(&local_138);
    std::filesystem::__cxx11::path::~path((path *)local_110);
    this_09 = context;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_198._M_allocated_capacity = local_198._M_allocated_capacity & 0xffffffffffffff00;
    local_1a8 = (undefined1  [8])paVar21;
    bVar10 = ArgsManager::ParseParameters
                       ((this->m_node).args,
                        (int)((ulong)((long)local_288.
                                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_288.
                                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3),
                        local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,(string *)local_1a8);
    if (!bVar10) {
      ArgsManager::ClearArgs((this->m_node).args);
      this_04 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_04,(string *)local_1a8);
      if ((Mining *)
          ((_Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_> *)
          (in_FS_OFFSET + 0x28))->super__Head_base<0UL,_interfaces::Mining_*,_false> ==
          local_38._M_head_impl) {
        __cxa_throw(this_04,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_008447b5;
    }
    if (local_1a8 != (undefined1  [8])paVar21) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
    }
    SeedRandomForTest(this,FIXED_SEED);
    pAVar1 = (this->m_node).args;
    local_1a8 = (undefined1  [8])paVar21;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"-testdatadir","");
    bVar10 = ArgsManager::IsArgSet(pAVar1,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])paVar21) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
    }
    if (!bVar10) {
      local_198._M_allocated_capacity = 0;
      local_198._8_8_ = 0;
      local_1a8 = (undefined1  [8])0x0;
      paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      output.m_size = 0x20;
      output.m_data = local_1a8;
      FastRandomContext::fillrand(&g_rng_temp_path,output);
      base_blob<256u>::ToString_abi_cxx11_(&local_138._M_pathname,local_1a8);
      std::filesystem::temp_directory_path_abi_cxx11_();
      std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                ((path *)local_e8,&TEST_DIR_PATH_ELEMENT,auto_format);
      std::filesystem::__cxx11::operator/((path *)local_1a8,(path *)local_c0,(path *)local_e8);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)local_110,&local_138._M_pathname,auto_format);
      std::filesystem::__cxx11::operator/
                ((path *)(local_1f0 + 0x20),(path *)local_1a8,(path *)local_110);
      path._M_pathname._M_string_length = (size_type)pBVar20;
      path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffce8;
      path._M_pathname.field_2._M_allocated_capacity = (size_type)this_08;
      path._M_pathname.field_2._8_8_ = this_09;
      path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl.
      _0_4_ = in_stack_fffffffffffffd08;
      path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl.
      _4_4_ = chainType;
      this_07 = pBVar20;
      fs::path::operator=((path *)pBVar20,path);
      std::filesystem::__cxx11::path::~path((path *)(local_1f0 + 0x20));
      std::filesystem::__cxx11::path::~path((path *)local_110);
      std::filesystem::__cxx11::path::~path((path *)local_1a8);
      std::filesystem::__cxx11::path::~path((path *)local_e8);
      std::filesystem::__cxx11::path::~path((path *)local_c0);
      TryCreateDirectories((path *)pBVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_pathname._M_dataplus._M_p != &local_138._M_pathname.field_2) {
        operator_delete(local_138._M_pathname._M_dataplus._M_p,
                        local_138._M_pathname.field_2._M_allocated_capacity + 1);
      }
LAB_00843caf:
      local_1a8 = (undefined1  [8])paVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"-datadir","");
      pcVar2 = (this->m_path_root).super_path._M_pathname._M_dataplus._M_p;
      pcVar5 = local_c0 + 0x10;
      local_c0._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,pcVar2,
                 pcVar2 + (this->m_path_root).super_path._M_pathname._M_string_length);
      ArgsManager::ForceSetArg(this_00,(string *)local_1a8,(string *)local_c0);
      if ((pointer)local_c0._0_8_ != pcVar5) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      if (local_1a8 != (undefined1  [8])paVar21) {
        operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
      }
      local_1a8 = (undefined1  [8])paVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"-datadir","");
      pcVar2 = (this->m_path_root).super_path._M_pathname._M_dataplus._M_p;
      local_c0._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,pcVar2,
                 pcVar2 + (this->m_path_root).super_path._M_pathname._M_string_length);
      ArgsManager::ForceSetArg(&gArgs,(string *)local_1a8,(string *)local_c0);
      if ((pointer)local_c0._0_8_ != pcVar5) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      if (local_1a8 != (undefined1  [8])paVar21) {
        operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
      }
      SelectParams(chainType);
      if (G_TEST_LOG_FUN_abi_cxx11_.super__Function_base._M_manager != (_Manager_type)0x0) {
        pLVar13 = LogInstance();
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_2e8,&G_TEST_LOG_FUN_abi_cxx11_);
        fun.super__Function_base._M_functor._8_8_ = this_07;
        fun.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffce8;
        fun.super__Function_base._M_manager = (_Manager_type)this_08;
        fun._M_invoker = (_Invoker_type)this_09;
        BCLog::Logger::PushBackCallback(pLVar13,fun);
        if (local_2d8 != (code *)0x0) {
          (*local_2d8)(&local_2e8,&local_2e8,__destroy_functor);
        }
      }
      InitLogging((this->m_node).args);
      AppInitParameterInteraction((this->m_node).args);
      pLVar13 = LogInstance();
      BCLog::Logger::StartLogging(pLVar13);
      this_01 = (Warnings *)operator_new(0x58);
      ::node::Warnings::Warnings(this_01);
      local_1a8 = (undefined1  [8])0x0;
      std::__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>::reset
                ((__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_> *)
                 &(this->m_node).warnings,this_01);
      std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::~unique_ptr
                ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)local_1a8);
      this_02._M_head_impl = (Context *)operator_new(1);
      kernel::Context::Context(this_02._M_head_impl);
      _Var3._M_head_impl =
           (context->kernel)._M_t.
           super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
           super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
           super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl;
      (context->kernel)._M_t.
      super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
      super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
      super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl = this_02._M_head_impl;
      if (_Var3._M_head_impl != (Context *)0x0) {
        operator_delete(_Var3._M_head_impl,1);
      }
      this_03 = (ECC_Context *)operator_new(1);
      ECC_Context::ECC_Context(this_03);
      local_1a8 = (undefined1  [8])0x0;
      std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
                ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)
                 &(this->m_node).ecc_context,this_03);
      std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::~unique_ptr
                ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)local_1a8);
      SetupEnvironment();
      interfaces::MakeChain((interfaces *)local_1a8,context);
      auVar19 = local_1a8;
      local_1a8 = (undefined1  [8])0x0;
      pCVar4 = (this->m_node).chain._M_t.
               super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
               _M_t.
               super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
               super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
      (this->m_node).chain._M_t.
      super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
      super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
      super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl = (Chain *)auVar19;
      if (pCVar4 != (Chain *)0x0) {
        (*pCVar4->_vptr_Chain[1])();
      }
      if (local_1a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1a8 + 8))();
      }
      if (BasicTestingSetup(ChainType,TestOpts)::noui_connected == '\0') {
        noui_connect();
        BasicTestingSetup(ChainType,TestOpts)::noui_connected = '\x01';
      }
      if (local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (char **)0x0) {
        operator_delete(local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_288.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((Mining *)
          ((_Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_> *)
          (in_FS_OFFSET + 0x28))->super__Head_base<0UL,_interfaces::Mining_*,_false> ==
          local_38._M_head_impl) {
        return;
      }
      goto LAB_008447b5;
    }
    this->m_has_custom_datadir = true;
    pAVar1 = (this->m_node).args;
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"-testdatadir","");
    this_05 = (path *)local_1a8;
    local_198._M_allocated_capacity = 0;
    local_198._8_8_ = 0;
    local_1a8 = (undefined1  [8])0x0;
    paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_188._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0;
    std::filesystem::__cxx11::path::path(this_05);
    arg_00._M_string_length = (size_type)pBVar20;
    arg_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffce8;
    arg_00.field_2._M_allocated_capacity = (size_type)this_08;
    arg_00.field_2._8_8_ = this_09;
    ArgsManager::GetPathArg((path *)local_c0,pAVar1,arg_00,(path *)local_1f0);
    std::filesystem::__cxx11::path::~path((path *)local_1a8);
    this_07 = pBVar20;
    this_06 = this_08;
    context = this_09;
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
      this_07 = pBVar20;
      this_06 = this_08;
      context = this_09;
    }
    this_08 = this_06;
    this_09 = context;
    if ((AddrMan *)local_c0._8_8_ == (AddrMan *)0x0) goto LAB_00844028;
    std::filesystem::absolute((path *)local_1a8);
    std::filesystem::__cxx11::path::path((path *)local_e8,(path *)local_1a8);
    std::filesystem::__cxx11::path::~path((path *)local_1a8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
    _Var9._M_head_impl = local_a0._M_head_impl;
    local_a0._M_head_impl =
         (_Impl *)local_c8._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl;
    local_c8._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0;
    if ((__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
         )_Var9._M_head_impl !=
        (tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         )0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&local_a0,(_Impl *)_Var9._M_head_impl);
    }
    pBVar20 = (BasicTestingSetup *)local_e8;
    std::filesystem::__cxx11::path::clear((path *)pBVar20);
    std::filesystem::__cxx11::path::~path((path *)pBVar20);
    if (G_TEST_GET_FULL_NAME_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_138._M_pathname._M_dataplus._M_p = (pointer)&local_138._M_pathname.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
    }
    else {
      (*G_TEST_GET_FULL_NAME_abi_cxx11_._M_invoker)
                (&local_138._M_pathname,(_Any_data *)&G_TEST_GET_FULL_NAME_abi_cxx11_);
    }
    std::filesystem::__cxx11::path::path(&local_240,(path *)local_c0);
    std::filesystem::__cxx11::path::_M_append(&local_240,0x13,"test_common bitcoin");
    std::filesystem::__cxx11::path::path(&local_218,&local_240);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_1a8,&local_138._M_pathname,auto_format);
    std::filesystem::__cxx11::path::path((path *)local_110,(path *)local_1a8);
    std::filesystem::__cxx11::path::~path((path *)local_1a8);
    std::filesystem::__cxx11::path::operator/=(&local_218,(path *)local_110);
    std::filesystem::__cxx11::path::path((path *)pBVar20,&local_218);
    this_08 = this_06;
    if (pBVar20 != this_06) {
      BasicTestingSetup(this_06);
    }
    std::filesystem::__cxx11::path::~path((path *)local_e8);
    std::filesystem::__cxx11::path::~path((path *)local_110);
    std::filesystem::__cxx11::path::~path(&local_218);
    std::filesystem::__cxx11::path::~path(&local_240);
    std::filesystem::__cxx11::path::path(&local_268,(path *)this_06);
    std::filesystem::__cxx11::path::_M_append(&local_268,7,"datadir");
    std::filesystem::__cxx11::path::path((path *)local_1a8,&local_268);
    if ((BasicTestingSetup *)local_1a8 != this_07) {
      BasicTestingSetup(this_07);
    }
    std::filesystem::__cxx11::path::~path((path *)local_1a8);
    std::filesystem::__cxx11::path::~path(&local_268);
    TryCreateDirectories((path *)this_06);
    local_e8._0_8_ = ".lock";
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              ((path *)local_1a8,(char **)local_e8,auto_format);
    LVar11 = util::LockDirectory((path *)this_06,(path *)local_1a8,false);
    std::filesystem::__cxx11::path::~path((path *)local_1a8);
    if (LVar11 != Success) goto LAB_00844050;
    std::filesystem::remove_all((path *)this_07);
    bVar10 = TryCreateDirectories((path *)this_07);
    if (bVar10) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Test directory (will not be deleted): ",0x26);
      pbVar12 = std::filesystem::__cxx11::operator<<
                          ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                           (path *)this_07);
      std::ios::widen((char)pbVar12->_vptr_basic_ostream[-3] + (char)pbVar12);
      std::ostream::put((char)pbVar12);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_pathname._M_dataplus._M_p != &local_138._M_pathname.field_2) {
        operator_delete(local_138._M_pathname._M_dataplus._M_p,
                        local_138._M_pathname.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path((path *)local_c0);
      goto LAB_00843caf;
    }
    if (*(Mining **)(in_FS_OFFSET + 0x28) != local_38._M_head_impl) goto LAB_008447b5;
    str_err_00._M_str = "Cannot create test data directory";
    str_err_00._M_len = 0x21;
    ExitFailure(str_err_00);
    pbVar14 = extraout_RAX;
    local_110._0_8_ = extraout_RDX;
LAB_008440e6:
    local_110._16_8_ = (this_05->_M_pathname)._M_dataplus._M_p;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_2c8,&local_288);
    if (G_TEST_COMMAND_LINE_ARGUMENTS.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*G_TEST_COMMAND_LINE_ARGUMENTS._M_invoker)
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1a8,
                 (_Any_data *)&G_TEST_COMMAND_LINE_ARGUMENTS);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
                (&local_2c8,
                 ((long)paStack_1a0 - (long)local_1a8 >> 3) +
                 ((long)local_2c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_2c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3));
      paVar21 = paStack_1a0;
      if (local_1a8 != (undefined1  [8])paStack_1a0) {
        auVar19 = local_1a8;
        do {
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_2c8,(char **)auVar19)
          ;
          auVar19 = (undefined1  [8])((long)auVar19 + 8);
        } while (auVar19 != (undefined1  [8])paVar21);
      }
      ppcVar8 = local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      ppcVar7 = local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_2c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_2c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_2c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (char **)0x0;
      local_2c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (char **)0x0;
      local_2c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (char **)0x0;
      if (ppcVar7 != (char **)0x0) {
        operator_delete(ppcVar7,(long)ppcVar8 - (long)ppcVar7);
      }
      if (local_1a8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1a8,local_198._M_allocated_capacity - (long)local_1a8);
      }
      if (local_2c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (char **)0x0) {
        operator_delete(local_2c8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2c8.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c8.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0084349a;
    }
    if (*(Mining **)(in_FS_OFFSET + 0x28) != local_38._M_head_impl) goto LAB_008447b5;
    std::__throw_bad_function_call();
LAB_00844028:
    if (*(Mining **)(in_FS_OFFSET + 0x28) != local_38._M_head_impl) goto LAB_008447b5;
    str_err._M_str = "-testdatadir argument is empty, please specify a path";
    str_err._M_len = 0x35;
    ExitFailure(str_err);
LAB_00844050:
    pcVar5 = (this->m_path_lock).super_path._M_pathname._M_dataplus._M_p;
    this_06 = (BasicTestingSetup *)(local_160 + 0x10);
    local_160._0_8_ = this_06;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_160,pcVar5,
               pcVar5 + (this->m_path_lock).super_path._M_pathname._M_string_length);
    pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160
                      ,0,0,"Cannot obtain a lock on test data lock directory ",0x31);
    pBVar20 = (BasicTestingSetup *)(local_110 + 0x10);
    local_110._0_8_ = (pbVar14->_M_dataplus)._M_p;
    this_05 = (path *)&pbVar14->field_2;
    if ((path *)local_110._0_8_ != this_05) goto LAB_008440e6;
    local_110._16_8_ = *(undefined8 *)this_05;
    local_110._24_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
    local_110._0_8_ = pBVar20;
  }
  local_110._8_8_ = pbVar14->_M_string_length;
  (pbVar14->_M_dataplus)._M_p = (pointer)this_05;
  pbVar14->_M_string_length = 0;
  (pbVar14->field_2)._M_local_buf[0] = '\0';
  pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_110,local_110._8_8_,0,1,'\n');
  local_e8._0_8_ = (pbVar14->_M_dataplus)._M_p;
  paVar16 = &pbVar14->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._0_8_ == paVar16) {
    local_d8._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_d8._8_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
    local_e8._0_8_ = &local_d8;
  }
  else {
    local_d8._M_allocated_capacity = paVar16->_M_allocated_capacity;
  }
  local_e8._8_8_ = pbVar14->_M_string_length;
  (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
  pbVar14->_M_string_length = 0;
  (pbVar14->field_2)._M_local_buf[0] = '\0';
  pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,"The test executable is probably already running.");
  local_1a8 = (undefined1  [8])(pbVar14->_M_dataplus)._M_p;
  paVar16 = &pbVar14->field_2;
  if (local_1a8 == (undefined1  [8])paVar16) {
    sVar6 = *(size_type *)((long)&pbVar14->field_2 + 8);
    paVar21->_M_allocated_capacity = paVar16->_M_allocated_capacity;
    (&paVar21->_M_allocated_capacity)[1] = sVar6;
    local_1a8 = (undefined1  [8])paVar21;
  }
  else {
    local_198._M_allocated_capacity = paVar16->_M_allocated_capacity;
  }
  paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pbVar14->_M_string_length;
  (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
  pbVar14->_M_string_length = 0;
  (pbVar14->field_2)._M_local_buf[0] = '\0';
  if ((Mining *)
      ((_Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_> *)
      (in_FS_OFFSET + 0x28))->super__Head_base<0UL,_interfaces::Mining_*,_false> ==
      local_38._M_head_impl) {
    str_err_01._M_str = (char *)local_1a8;
    str_err_01._M_len = (size_t)paStack_1a0;
    ExitFailure(str_err_01);
    if (local_1a8 != (undefined1  [8])paVar21) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != &local_d8) {
      operator_delete((void *)local_e8._0_8_,local_d8._M_allocated_capacity + 1);
    }
    if ((BasicTestingSetup *)local_110._0_8_ != pBVar20) {
      operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
    }
    if ((BasicTestingSetup *)local_160._0_8_ != this_06) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_pathname._M_dataplus._M_p != &local_138._M_pathname.field_2) {
      operator_delete(local_138._M_pathname._M_dataplus._M_p,
                      local_138._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_c0);
    if (local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (char **)0x0) {
      operator_delete(local_288.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_288.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    ArgsManager::~ArgsManager(this_00);
    std::filesystem::__cxx11::path::~path((path *)this_08);
    std::filesystem::__cxx11::path::~path((path *)this_07);
    ChaCha20::~ChaCha20(&(this->m_rng).rng);
    ::node::NodeContext::~NodeContext(this_09);
    TokenPipeEnd::~TokenPipeEnd(&(this->m_interrupt).m_pipe_w);
    TokenPipeEnd::~TokenPipeEnd(&(this->m_interrupt).m_pipe_r);
    if ((Mining *)
        ((_Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_> *)
        (in_FS_OFFSET + 0x28))->super__Head_base<0UL,_interfaces::Mining_*,_false> ==
        local_38._M_head_impl) {
      _Unwind_Resume(extraout_RAX_00);
    }
  }
LAB_008447b5:
  __stack_chk_fail();
}

Assistant:

BasicTestingSetup::BasicTestingSetup(const ChainType chainType, TestOpts opts)
    : m_args{}
{
    m_node.shutdown = &m_interrupt;
    m_node.args = &gArgs;
    std::vector<const char*> arguments = Cat(
        {
            "dummy",
            "-printtoconsole=0",
            "-logsourcelocations",
            "-logtimemicros",
            "-logthreadnames",
            "-loglevel=trace",
            "-debug",
            "-debugexclude=libevent",
            "-debugexclude=leveldb",
        },
        opts.extra_args);
    if (G_TEST_COMMAND_LINE_ARGUMENTS) {
        arguments = Cat(arguments, G_TEST_COMMAND_LINE_ARGUMENTS());
    }
    util::ThreadRename("test");
    gArgs.ClearPathCache();
    {
        SetupServerArgs(*m_node.args);
        SetupUnitTestArgs(*m_node.args);
        std::string error;
        if (!m_node.args->ParseParameters(arguments.size(), arguments.data(), error)) {
            m_node.args->ClearArgs();
            throw std::runtime_error{error};
        }
    }

    // Use randomly chosen seed for deterministic PRNG, so that (by default) test
    // data directories use a random name that doesn't overlap with other tests.
    SeedRandomForTest(SeedRand::FIXED_SEED);

    if (!m_node.args->IsArgSet("-testdatadir")) {
        // By default, the data directory has a random name
        const auto rand_str{g_rng_temp_path.rand256().ToString()};
        m_path_root = fs::temp_directory_path() / TEST_DIR_PATH_ELEMENT / rand_str;
        TryCreateDirectories(m_path_root);
    } else {
        // Custom data directory
        m_has_custom_datadir = true;
        fs::path root_dir{m_node.args->GetPathArg("-testdatadir")};
        if (root_dir.empty()) ExitFailure("-testdatadir argument is empty, please specify a path");

        root_dir = fs::absolute(root_dir);
        const std::string test_path{G_TEST_GET_FULL_NAME ? G_TEST_GET_FULL_NAME() : ""};
        m_path_lock = root_dir / TEST_DIR_PATH_ELEMENT / fs::PathFromString(test_path);
        m_path_root = m_path_lock / "datadir";

        // Try to obtain the lock; if unsuccessful don't disturb the existing test.
        TryCreateDirectories(m_path_lock);
        if (util::LockDirectory(m_path_lock, ".lock", /*probe_only=*/false) != util::LockResult::Success) {
            ExitFailure("Cannot obtain a lock on test data lock directory " + fs::PathToString(m_path_lock) + '\n' + "The test executable is probably already running.");
        }

        // Always start with a fresh data directory; this doesn't delete the .lock file located one level above.
        fs::remove_all(m_path_root);
        if (!TryCreateDirectories(m_path_root)) ExitFailure("Cannot create test data directory");

        // Print the test directory name if custom.
        std::cout << "Test directory (will not be deleted): " << m_path_root << std::endl;
    }
    m_args.ForceSetArg("-datadir", fs::PathToString(m_path_root));
    gArgs.ForceSetArg("-datadir", fs::PathToString(m_path_root));

    SelectParams(chainType);
    if (G_TEST_LOG_FUN) LogInstance().PushBackCallback(G_TEST_LOG_FUN);
    InitLogging(*m_node.args);
    AppInitParameterInteraction(*m_node.args);
    LogInstance().StartLogging();
    m_node.warnings = std::make_unique<node::Warnings>();
    m_node.kernel = std::make_unique<kernel::Context>();
    m_node.ecc_context = std::make_unique<ECC_Context>();
    SetupEnvironment();

    m_node.chain = interfaces::MakeChain(m_node);
    static bool noui_connected = false;
    if (!noui_connected) {
        noui_connect();
        noui_connected = true;
    }
}